

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

uchar * stbi__convert_format(uchar *data,int img_n,int req_comp,uint x,uint y)

{
  byte bVar1;
  uchar uVar2;
  int iVar3;
  uchar *puVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  byte *pbVar9;
  byte *pbVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  
  if (req_comp != img_n) {
    if (3 < req_comp - 1U) {
      __assert_fail("req_comp >= 1 && req_comp <= 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/RayTracing[P]raytracing/src/external/stb_image.h"
                    ,0x52d,
                    "unsigned char *stbi__convert_format(unsigned char *, int, int, unsigned int, unsigned int)"
                   );
    }
    puVar4 = (uchar *)malloc((ulong)(x * req_comp * y));
    if (puVar4 == (uchar *)0x0) {
      free(data);
      stbi__g_failure_reason = "Out of memory";
      data = (uchar *)0x0;
    }
    else {
      iVar13 = req_comp + img_n * 8;
      uVar5 = 0;
      if ((int)y < 1) {
        y = 0;
      }
      iVar3 = x - 1;
      uVar11 = 0;
      for (uVar12 = 0; uVar12 != y; uVar12 = uVar12 + 1) {
        if (0x19 < iVar13 - 10U) {
switchD_0010f01a_caseD_d:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/RayTracing[P]raytracing/src/external/stb_image.h"
                        ,0x54a,
                        "unsigned char *stbi__convert_format(unsigned char *, int, int, unsigned int, unsigned int)"
                       );
        }
        uVar6 = (ulong)uVar5;
        iVar8 = (int)uVar12 * x;
        pbVar10 = data + (uint)(iVar8 * img_n);
        pbVar9 = puVar4 + (uint)(iVar8 * req_comp);
        switch(iVar13) {
        case 10:
          lVar7 = 0;
          for (iVar8 = iVar3; -1 < iVar8; iVar8 = iVar8 + -1) {
            puVar4[lVar7 * 2 + uVar6] = data[lVar7 + uVar11];
            puVar4[lVar7 * 2 + uVar6 + 1] = 0xff;
            lVar7 = lVar7 + 1;
          }
          break;
        case 0xb:
          pbVar9 = puVar4 + uVar6 + 2;
          for (iVar8 = iVar3; -1 < iVar8; iVar8 = iVar8 + -1) {
            bVar1 = *pbVar10;
            *pbVar9 = bVar1;
            pbVar9[-1] = bVar1;
            pbVar9[-2] = bVar1;
            pbVar10 = pbVar10 + 1;
            pbVar9 = pbVar9 + 3;
          }
          break;
        case 0xc:
          lVar7 = 0;
          for (iVar8 = iVar3; -1 < iVar8; iVar8 = iVar8 + -1) {
            uVar2 = data[lVar7 + uVar11];
            puVar4[lVar7 * 4 + uVar6 + 2] = uVar2;
            puVar4[lVar7 * 4 + uVar6 + 1] = uVar2;
            puVar4[lVar7 * 4 + uVar6] = uVar2;
            puVar4[lVar7 * 4 + uVar6 + 3] = 0xff;
            lVar7 = lVar7 + 1;
          }
          break;
        default:
          goto switchD_0010f01a_caseD_d;
        case 0x11:
          lVar7 = 0;
          for (iVar8 = iVar3; -1 < iVar8; iVar8 = iVar8 + -1) {
            puVar4[lVar7 + uVar6] = data[lVar7 * 2 + uVar11];
            lVar7 = lVar7 + 1;
          }
          break;
        case 0x13:
          pbVar9 = puVar4 + uVar6 + 2;
          for (iVar8 = iVar3; -1 < iVar8; iVar8 = iVar8 + -1) {
            bVar1 = *pbVar10;
            *pbVar9 = bVar1;
            pbVar9[-1] = bVar1;
            pbVar9[-2] = bVar1;
            pbVar10 = pbVar10 + 2;
            pbVar9 = pbVar9 + 3;
          }
          break;
        case 0x14:
          lVar7 = 0;
          for (iVar8 = iVar3; -1 < iVar8; iVar8 = iVar8 + -1) {
            uVar2 = data[lVar7 + uVar11];
            puVar4[lVar7 * 2 + uVar6 + 2] = uVar2;
            puVar4[lVar7 * 2 + uVar6 + 1] = uVar2;
            puVar4[lVar7 * 2 + uVar6] = uVar2;
            puVar4[lVar7 * 2 + uVar6 + 3] = data[lVar7 + uVar11 + 1];
            lVar7 = lVar7 + 2;
          }
          break;
        case 0x19:
          for (iVar8 = iVar3; -1 < iVar8; iVar8 = iVar8 + -1) {
            *pbVar9 = (byte)((uint)pbVar10[2] * 0x1d +
                             (uint)pbVar10[1] * 0x96 + (uint)*pbVar10 * 0x4d >> 8);
            pbVar10 = pbVar10 + 3;
            pbVar9 = pbVar9 + 1;
          }
          break;
        case 0x1a:
          for (iVar8 = iVar3; -1 < iVar8; iVar8 = iVar8 + -1) {
            *pbVar9 = (byte)((uint)pbVar10[2] * 0x1d +
                             (uint)pbVar10[1] * 0x96 + (uint)*pbVar10 * 0x4d >> 8);
            pbVar9[1] = 0xff;
            pbVar10 = pbVar10 + 3;
            pbVar9 = pbVar9 + 2;
          }
          break;
        case 0x1c:
          for (iVar8 = iVar3; -1 < iVar8; iVar8 = iVar8 + -1) {
            *pbVar9 = *pbVar10;
            pbVar9[1] = pbVar10[1];
            pbVar9[2] = pbVar10[2];
            pbVar9[3] = 0xff;
            pbVar10 = pbVar10 + 3;
            pbVar9 = pbVar9 + 4;
          }
          break;
        case 0x21:
          lVar7 = 0;
          for (iVar8 = iVar3; -1 < iVar8; iVar8 = iVar8 + -1) {
            puVar4[lVar7 + uVar6] =
                 (uchar)((uint)data[lVar7 * 4 + uVar11 + 2] * 0x1d +
                         (uint)data[lVar7 * 4 + uVar11 + 1] * 0x96 +
                         (uint)data[lVar7 * 4 + uVar11] * 0x4d >> 8);
            lVar7 = lVar7 + 1;
          }
          break;
        case 0x22:
          lVar7 = 0;
          for (iVar8 = iVar3; -1 < iVar8; iVar8 = iVar8 + -1) {
            puVar4[lVar7 + uVar6] =
                 (uchar)((uint)data[lVar7 * 2 + uVar11 + 2] * 0x1d +
                         (uint)data[lVar7 * 2 + uVar11 + 1] * 0x96 +
                         (uint)data[lVar7 * 2 + uVar11] * 0x4d >> 8);
            puVar4[lVar7 + uVar6 + 1] = data[lVar7 * 2 + uVar11 + 3];
            lVar7 = lVar7 + 2;
          }
          break;
        case 0x23:
          for (iVar8 = iVar3; -1 < iVar8; iVar8 = iVar8 + -1) {
            *pbVar9 = *pbVar10;
            pbVar9[1] = pbVar10[1];
            pbVar9[2] = pbVar10[2];
            pbVar10 = pbVar10 + 4;
            pbVar9 = pbVar9 + 3;
          }
        }
        uVar11 = (ulong)((int)uVar11 + x * img_n);
        uVar5 = uVar5 + x * req_comp;
      }
      free(data);
      data = puVar4;
    }
  }
  return data;
}

Assistant:

static unsigned char *stbi__convert_format(unsigned char *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   unsigned char *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (unsigned char *) stbi__malloc(req_comp * x * y);
   if (good == NULL) {
      STBI_FREE(data);
      return stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      unsigned char *src  = data + j * x * img_n   ;
      unsigned char *dest = good + j * x * req_comp;

      #define COMBO(a,b)  ((a)*8+(b))
      #define CASE(a,b)   case COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (COMBO(img_n, req_comp)) {
         CASE(1,2) dest[0]=src[0], dest[1]=255; break;
         CASE(1,3) dest[0]=dest[1]=dest[2]=src[0]; break;
         CASE(1,4) dest[0]=dest[1]=dest[2]=src[0], dest[3]=255; break;
         CASE(2,1) dest[0]=src[0]; break;
         CASE(2,3) dest[0]=dest[1]=dest[2]=src[0]; break;
         CASE(2,4) dest[0]=dest[1]=dest[2]=src[0], dest[3]=src[1]; break;
         CASE(3,4) dest[0]=src[0],dest[1]=src[1],dest[2]=src[2],dest[3]=255; break;
         CASE(3,1) dest[0]=stbi__compute_y(src[0],src[1],src[2]); break;
         CASE(3,2) dest[0]=stbi__compute_y(src[0],src[1],src[2]), dest[1] = 255; break;
         CASE(4,1) dest[0]=stbi__compute_y(src[0],src[1],src[2]); break;
         CASE(4,2) dest[0]=stbi__compute_y(src[0],src[1],src[2]), dest[1] = src[3]; break;
         CASE(4,3) dest[0]=src[0],dest[1]=src[1],dest[2]=src[2]; break;
         default: STBI_ASSERT(0);
      }
      #undef CASE
   }

   STBI_FREE(data);
   return good;
}